

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

t_float glist_pixelstoy(_glist *x,t_float ypix)

{
  int local_2c;
  int local_28;
  int y2;
  int x2;
  int y1;
  int x1;
  t_float ypix_local;
  _glist *x_local;
  
  if ((*(ushort *)&x->field_0xe8 >> 8 & 1) == 0) {
    x_local._4_4_ = x->gl_y1 + ((x->gl_y2 - x->gl_y1) * ypix) / (float)x->gl_zoom;
  }
  else if (((*(ushort *)&x->field_0xe8 >> 8 & 1) == 0) || ((*(ushort *)&x->field_0xe8 & 1) == 0)) {
    y1 = (int)ypix;
    _x1 = x;
    if (x->gl_owner == (_glist *)0x0) {
      bug("glist_pixelstox");
    }
    graph_graphrect((t_gobj *)_x1,_x1->gl_owner,&x2,&y2,&local_28,&local_2c);
    x_local._4_4_ =
         _x1->gl_y1 + ((_x1->gl_y2 - _x1->gl_y1) * ((float)y1 - (float)y2)) / (float)(local_2c - y2)
    ;
  }
  else {
    x_local._4_4_ =
         x->gl_y1 + ((x->gl_y2 - x->gl_y1) * ypix) / (float)(x->gl_screeny2 - x->gl_screeny1);
  }
  return x_local._4_4_;
}

Assistant:

t_float glist_pixelstoy(t_glist *x, t_float ypix)
{
    if (!x->gl_isgraph)
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) * ypix / x->gl_zoom);
    else if (x->gl_isgraph && x->gl_havewindow)
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) *
                (ypix) / (x->gl_screeny2 - x->gl_screeny1));
    else
    {
        int x1, y1, x2, y2;
        if (!x->gl_owner)
            bug("glist_pixelstox");
        graph_graphrect(&x->gl_gobj, x->gl_owner, &x1, &y1, &x2, &y2);
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) *
            (ypix - y1) / (y2 - y1));
    }
}